

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_TYPE av1_get_tx_type(MACROBLOCKD *xd,PLANE_TYPE plane_type,int blk_row,int blk_col,
                       TX_SIZE tx_size,int reduced_tx_set)

{
  byte bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  TxSetType tx_set_type;
  macroblockd_plane *pd;
  TX_TYPE tx_type;
  MB_MODE_INFO *mbmi;
  PLANE_TYPE in_stack_ffffffffffffffbf;
  MB_MODE_INFO *in_stack_ffffffffffffffc0;
  byte local_31;
  byte local_1;
  
  if ((*(int *)(in_RDI + 0x29c4 +
               (ulong)((byte)*(undefined2 *)(**(long **)(in_RDI + 0x1eb8) + 0xa7) & 7) * 4) == 0) &&
     (""[in_R8B] < 4)) {
    if (in_SIL == 0) {
      local_31 = *(byte *)(*(long *)(in_RDI + 0x1ee8) +
                          (long)(in_EDX * *(int *)(in_RDI + 0x1ef0) + in_ECX));
    }
    else {
      iVar2 = is_inter_block(in_stack_ffffffffffffffc0);
      if (iVar2 == 0) {
        local_31 = intra_mode_to_tx_type(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
      }
      else {
        in_stack_ffffffffffffffc0 = (MB_MODE_INFO *)(in_RDI + 0x10 + (ulong)in_SIL * 0xa30);
        local_31 = *(byte *)(*(long *)(in_RDI + 0x1ee8) +
                            (long)((in_EDX << ((byte)in_stack_ffffffffffffffc0->mv[0].as_int & 0x1f)
                                   ) * *(int *)(in_RDI + 0x1ef0) +
                                  (in_ECX <<
                                  ((byte)in_stack_ffffffffffffffc0->current_qindex & 0x1f))));
      }
      iVar2 = is_inter_block(in_stack_ffffffffffffffc0);
      bVar1 = av1_get_ext_tx_set_type(in_R8B,iVar2,in_R9D);
      if (av1_ext_tx_used[bVar1][local_31] == 0) {
        local_31 = 0;
      }
    }
    local_1 = local_31;
  }
  else {
    local_1 = 0;
  }
  return local_1;
}

Assistant:

static inline TX_TYPE av1_get_tx_type(const MACROBLOCKD *xd,
                                      PLANE_TYPE plane_type, int blk_row,
                                      int blk_col, TX_SIZE tx_size,
                                      int reduced_tx_set) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  if (xd->lossless[mbmi->segment_id] || txsize_sqr_up_map[tx_size] > TX_32X32) {
    return DCT_DCT;
  }

  TX_TYPE tx_type;
  if (plane_type == PLANE_TYPE_Y) {
    tx_type = xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
  } else {
    if (is_inter_block(mbmi)) {
      // scale back to y plane's coordinate
      const struct macroblockd_plane *const pd = &xd->plane[plane_type];
      blk_row <<= pd->subsampling_y;
      blk_col <<= pd->subsampling_x;
      tx_type = xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col];
    } else {
      // In intra mode, uv planes don't share the same prediction mode as y
      // plane, so the tx_type should not be shared
      tx_type = intra_mode_to_tx_type(mbmi, PLANE_TYPE_UV);
    }
    const TxSetType tx_set_type =
        av1_get_ext_tx_set_type(tx_size, is_inter_block(mbmi), reduced_tx_set);
    if (!av1_ext_tx_used[tx_set_type][tx_type]) tx_type = DCT_DCT;
  }
  assert(tx_type < TX_TYPES);
  assert(av1_ext_tx_used[av1_get_ext_tx_set_type(tx_size, is_inter_block(mbmi),
                                                 reduced_tx_set)][tx_type]);
  return tx_type;
}